

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char> __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::buffer_appender<char>>
          (float_writer<char> *this,buffer_appender<char> it)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar1;
  buffer_appender<char> bVar2;
  bool bVar3;
  value_type local_181;
  char local_159;
  float_writer<char> *local_158;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_150;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_148;
  int local_140;
  int local_13c;
  int num_digits_1;
  int num_zeros_3;
  value_type local_12a;
  char local_129;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_128;
  int local_114;
  float_writer<char> *pfStack_110;
  int num_zeros_2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_108;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_100;
  float_writer<char> *local_f8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_f0;
  int local_e4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_e0;
  int num_digits;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_d8;
  char local_c9;
  float_writer<char> *local_c8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b8;
  value_type local_ad;
  int local_ac;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_a8;
  int num_zeros_1;
  char local_99;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_98;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_90;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_88;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_80;
  float_writer<char> *local_78;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_70;
  value_type local_62;
  char local_61;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_60;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_58;
  float_writer<char> *local_50;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_48;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_40;
  int local_34;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_30;
  int num_zeros;
  char local_25;
  int local_24;
  float_writer<char> *pfStack_20;
  int full_exp;
  float_writer<char> *this_local;
  buffer_appender<char> it_local;
  
  local_24 = this->num_digits_ + this->exp_;
  pfStack_20 = this;
  this_local = (float_writer<char> *)
               it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if ((char)*(undefined4 *)&(this->specs_).field_0x4 == '\x01') {
    local_25 = *this->digits_;
    bStack_30.container =
         (buffer<char> *)buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
    pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
                       (&stack0xffffffffffffffd0);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_25);
    local_34 = (this->specs_).precision - this->num_digits_;
    if ((1 < this->num_digits_) || ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      local_40.container =
           (buffer<char> *)buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0)
      ;
      pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_40);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                (pbVar1,&this->decimal_point_);
    }
    local_50 = this_local;
    local_48.container =
         (buffer<char> *)
         copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                   (this->digits_ + 1,this->digits_ + this->num_digits_,
                    (buffer_appender<char>)this_local);
    this_local = (float_writer<char> *)local_48.container;
    if ((0 < local_34) && ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      local_61 = '0';
      local_60.container = local_48.container;
      local_58.container =
           (buffer<char> *)
           std::fill_n<fmt::v7::detail::buffer_appender<char>,int,char>
                     ((buffer_appender<char>)local_48.container,local_34,&local_61);
      this_local = (float_writer<char> *)local_58.container;
    }
    local_181 = 'E';
    if ((*(uint *)&(this->specs_).field_0x4 & 0x10000) == 0) {
      local_181 = 'e';
    }
    local_62 = local_181;
    local_70.container =
         (buffer<char> *)buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
    pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_70);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_62);
    local_78 = this_local;
    it_local = write_exponent<char,fmt::v7::detail::buffer_appender<char>>
                         (local_24 + -1,(buffer_appender<char>)this_local);
  }
  else {
    if (local_24 < this->num_digits_) {
      if (local_24 < 1) {
        local_12a = '0';
        _num_digits_1 =
             (buffer<char> *)
             buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
        pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
                           ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&num_digits_1);
        std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_12a);
        local_13c = -local_24;
        local_140 = this->num_digits_;
        if (((local_140 == 0) && (-1 < (this->specs_).precision)) &&
           ((this->specs_).precision < local_13c)) {
          local_13c = (this->specs_).precision;
        }
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          while( true ) {
            bVar3 = false;
            if (0 < local_140) {
              bVar3 = this->digits_[local_140 + -1] == '0';
            }
            if (!bVar3) break;
            local_140 = local_140 + -1;
          }
        }
        if (((local_13c != 0) || (local_140 != 0)) ||
           ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
          local_148.container =
               (buffer<char> *)
               buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
          pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_148);
          std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                    (pbVar1,&this->decimal_point_);
          local_158 = this_local;
          local_159 = '0';
          local_150.container =
               (buffer<char> *)
               std::fill_n<fmt::v7::detail::buffer_appender<char>,int,char>
                         ((buffer_appender<char>)this_local,local_13c,&local_159);
          this_local = (float_writer<char> *)local_150.container;
          this_local = (float_writer<char> *)
                       copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                                 (this->digits_,this->digits_ + local_140,
                                  (buffer_appender<char>)local_150.container);
        }
      }
      else {
        bStack_e0 = it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        local_d8.container =
             (buffer<char> *)
             copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                       (this->digits_,this->digits_ + local_24,it);
        this_local = (float_writer<char> *)local_d8.container;
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          local_e4 = this->num_digits_;
          while( true ) {
            bVar3 = false;
            if (local_24 < local_e4) {
              bVar3 = this->digits_[local_e4 + -1] == '0';
            }
            if (!bVar3) break;
            local_e4 = local_e4 + -1;
          }
          if (local_e4 != local_24) {
            local_f0.container =
                 (buffer<char> *)
                 buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
            pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_f0)
            ;
            std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                      (pbVar1,&this->decimal_point_);
          }
          local_f8 = this_local;
          bVar2 = copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                            (this->digits_ + local_24,this->digits_ + local_e4,
                             (buffer_appender<char>)this_local);
          return (buffer_appender<char>)
                 bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.
                 container;
        }
        local_100.container =
             (buffer<char> *)
             buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
        pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_100);
        std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                  (pbVar1,&this->decimal_point_);
        pfStack_110 = this_local;
        local_128.container =
             (buffer<char> *)
             copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                       (this->digits_ + local_24,this->digits_ + this->num_digits_,
                        (buffer_appender<char>)this_local);
        this_local = (float_writer<char> *)local_128.container;
        if (this->num_digits_ < (this->specs_).precision) {
          local_114 = (this->specs_).precision - this->num_digits_;
          local_129 = '0';
          local_108.container = local_128.container;
          this_local = (float_writer<char> *)
                       std::fill_n<fmt::v7::detail::buffer_appender<char>,int,char>
                                 ((buffer_appender<char>)local_128.container,local_114,&local_129);
        }
      }
    }
    else {
      local_88 = it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_98.container =
           (buffer<char> *)
           copy_str<char,_const_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                     (this->digits_,this->digits_ + this->num_digits_,it);
      local_99 = '0';
      local_80.container = local_98.container;
      this_local = (float_writer<char> *)local_98.container;
      local_90.container =
           (buffer<char> *)
           std::fill_n<fmt::v7::detail::buffer_appender<char>,int,char>
                     ((buffer_appender<char>)local_98.container,local_24 - this->num_digits_,
                      &local_99);
      this_local = (float_writer<char> *)local_90.container;
      if (((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0) || ((this->specs_).precision < 0))
      {
        bStack_a8.container =
             (buffer<char> *)
             buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
        pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
                           (&stack0xffffffffffffff58);
        std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                  (pbVar1,&this->decimal_point_);
        local_ac = (this->specs_).precision - local_24;
        if (local_ac < 1) {
          if ((char)*(undefined4 *)&(this->specs_).field_0x4 != '\x02') {
            local_ad = '0';
            local_b8.container =
                 (buffer<char> *)
                 buffer_appender<char>::operator++((buffer_appender<char> *)&this_local,0);
            pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_b8)
            ;
            std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_ad);
          }
          return ((buffer_appender<char>)(buffer_appender<char>)this_local).
                 super_back_insert_iterator<fmt::v7::detail::buffer<char>_>;
        }
        local_c8 = this_local;
        local_c9 = '0';
        this_local = (float_writer<char> *)
                     std::fill_n<fmt::v7::detail::buffer_appender<char>,int,char>
                               ((buffer_appender<char>)this_local,local_ac,&local_c9);
      }
    }
    it_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)this_local;
  }
  return (buffer_appender<char>)
         it_local.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }